

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalIndexManager.hpp
# Opt level: O2

int __thiscall OpenMD::IndexListContainer::pop(IndexListContainer *this)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  _List_node_base *p_Var4;
  list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *this_00;
  
  p_Var4 = (this->indexContainer_).
           super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  this_00 = &this->indexContainer_;
  if (p_Var4 == (_List_node_base *)this_00) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"");
    std::endl<char,std::char_traits<char>>(poVar3);
    p_Var4 = (this_00->super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)
             ._M_impl._M_node.super__List_node_base._M_next;
  }
  iVar2 = *(int *)&p_Var4[1]._M_next;
  iVar1 = *(int *)((long)&p_Var4[1]._M_next + 4);
  if (iVar2 == iVar1) {
    std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::pop_front
              (this_00);
  }
  else if (iVar2 < iVar1) {
    *(int *)&p_Var4[1]._M_next = iVar2 + 1;
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  return iVar2;
}

Assistant:

int pop() {
      if (indexContainer_.empty()) { std::cerr << "" << std::endl; }

      int result;

      result = indexContainer_.front().first;

      if (indexContainer_.front().first == indexContainer_.front().second) {
        indexContainer_.pop_front();
      } else if (indexContainer_.front().first <
                 indexContainer_.front().second) {
        ++indexContainer_.front().first;
      } else {
        std::cerr << "" << std::endl;
      }

      return result;
    }